

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void process_shader(GLuint *shader,char *source,GLint shader_type)

{
  GLuint GVar1;
  GLenum GVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uStack_440;
  undefined1 auStack_438 [12];
  GLint status;
  GLchar *local_428;
  GLsizei length;
  char buffer [1024];
  
  puVar5 = (undefined8 *)auStack_438;
  status = 0;
  uStack_440 = 0x104999;
  GVar1 = (*ctx.glCreateShader)(shader_type);
  *shader = GVar1;
  uStack_440 = 0x1049a1;
  GVar2 = (*ctx.glGetError)();
  if (GVar2 == 0) {
    uStack_440 = 0x1049ba;
    local_428 = source;
    (*ctx.glShaderSource)(*shader,1,&local_428,(GLint *)0x0);
    uStack_440 = 0x1049c0;
    GVar2 = (*ctx.glGetError)();
    if (GVar2 == 0) {
      local_428 = (char *)0x0;
      uStack_440 = 0x1049d2;
      (*ctx.glCompileShader)(*shader);
      uStack_440 = 0x1049d8;
      GVar2 = (*ctx.glGetError)();
      if (GVar2 == 0) {
        uStack_440 = 0x1049ee;
        (*ctx.glGetShaderiv)(*shader,0x8b81,&status);
        uStack_440 = 0x1049f4;
        GVar2 = (*ctx.glGetError)();
        if (GVar2 == 0) {
          if (status == 1) {
            return;
          }
          do {
            GVar1 = *shader;
            shader = (GLuint *)((long)puVar5 + 0x1c);
            *(undefined8 *)((long)puVar5 + -8) = 0x104a7c;
            (*ctx.glGetProgramInfoLog)
                      (GVar1,0x400,(GLsizei *)shader,(GLchar *)((long)puVar5 + 0x20));
            *(undefined1 *)((long)puVar5 + (long)(int)*shader + 0x20) = 0;
            *(undefined8 *)((long)puVar5 + -8) = 0x104a95;
            SDL_Log("Shader compilation failed: %s",(GLchar *)((long)puVar5 + 0x20));
            *(undefined8 *)((long)puVar5 + -8) = 0x104aa4;
            fflush(_stderr);
            puVar4 = (undefined8 *)((long)puVar5 + -8);
            *(undefined8 *)((long)puVar5 + -8) = 0xffffffffffffffff;
LAB_00104a59:
            uVar3 = *puVar4;
            puVar5 = puVar4 + 1;
            *puVar4 = 0x104a5f;
            quit((int)uVar3);
          } while( true );
        }
        uVar3 = 0xd1;
      }
      else {
        uVar3 = 0xd0;
      }
    }
    else {
      uVar3 = 0xca;
    }
  }
  else {
    uVar3 = 0xc6;
  }
  uStack_440 = 0x104a57;
  SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,uVar3);
  puVar4 = &uStack_440;
  uStack_440 = 1;
  goto LAB_00104a59;
}

Assistant:

void 
process_shader(GLuint *shader, const char * source, GLint shader_type)
{
    GLint status = GL_FALSE;
    const char *shaders[1] = { NULL };
    char buffer[1024];
    GLsizei length;

    /* Create shader and load into GL. */
    *shader = GL_CHECK(ctx.glCreateShader(shader_type));

    shaders[0] = source;

    GL_CHECK(ctx.glShaderSource(*shader, 1, shaders, NULL));

    /* Clean up shader source. */
    shaders[0] = NULL;

    /* Try compiling the shader. */
    GL_CHECK(ctx.glCompileShader(*shader));
    GL_CHECK(ctx.glGetShaderiv(*shader, GL_COMPILE_STATUS, &status));

    /* Dump debug info (source and log) if compilation failed. */
    if(status != GL_TRUE) {
        ctx.glGetProgramInfoLog(*shader, sizeof(buffer), &length, &buffer[0]);
        buffer[length] = '\0';
        SDL_Log("Shader compilation failed: %s", buffer);fflush(stderr);
        quit(-1);
    }
}